

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O1

fy_token * fy_token_alloc(void)

{
  fy_token *__s;
  long lVar1;
  
  __s = (fy_token *)malloc(0x130);
  if (__s != (fy_token *)0x0) {
    lVar1 = 0;
    memset(__s,0,0x130);
    do {
      *(undefined8 *)((long)&__s->comment[0].fyi + lVar1) = 0;
      lVar1 = lVar1 + 0x38;
    } while (lVar1 != 0xa8);
    __s->refs = 1;
  }
  return __s;
}

Assistant:

struct fy_token *fy_token_alloc(void) {
    struct fy_token *fyt;
    unsigned int i;

    fyt = malloc(sizeof(*fyt));
    if (!fyt)
        return fyt;

    memset(fyt, 0, sizeof(*fyt));

    fyt->type = FYTT_NONE;
    fyt->analyze_flags = 0;
    fyt->text_len = 0;
    fyt->text = NULL;
    fyt->text0 = NULL;
    fyt->handle.fyi = NULL;
    for (i = 0; i < sizeof(fyt->comment) / sizeof(fyt->comment[0]); i++)
        fyt->comment[i].fyi = NULL;

    fyt->refs = 1;

    return fyt;
}